

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

void __thiscall
ddd::DictionaryMLT<true,_true>::DictionaryMLT(DictionaryMLT<true,_true> *this,istream *is)

{
  DaTrie<true,_true,_true> *this_00;
  DaTrie<true,_true,_false> *this_01;
  long lVar1;
  ulong uVar2;
  bool has_trie;
  size_t num_suffixes;
  char local_49;
  DictionaryMLT<true,_true> *local_48;
  size_type local_40;
  DictionaryMLT<true,_true> *local_38;
  
  *(undefined ***)this = &PTR__DictionaryMLT_00140cb0;
  local_48 = this + 0x10;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  local_38 = this + 8;
  this_00 = (DaTrie<true,_true,_true> *)operator_new(0x70);
  DaTrie<true,_true,_true>::DaTrie(this_00,is);
  std::
  __uniq_ptr_impl<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
           *)(this + 8),this_00);
  local_40 = 0;
  std::istream::read((char *)is,(long)&local_40);
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
  ::resize((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
            *)local_48,local_40);
  if (local_40 != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      local_49 = '\0';
      std::istream::read((char *)is,(long)&local_49);
      if (local_49 == '\x01') {
        this_01 = (DaTrie<true,_true,_false> *)operator_new(0x70);
        DaTrie<true,_true,_false>::DaTrie(this_01,is);
        std::
        __uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
        ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                 *)(*(long *)local_48 + lVar1),this_01);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 8;
    } while (uVar2 < local_40);
  }
  std::istream::read((char *)is,(long)(this + 0x28));
  std::istream::read((char *)is,(long)(this + 0x30));
  return;
}

Assistant:

DictionaryMLT(std::istream& is) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(is);
    size_t num_suffixes = 0;
    utils::read_value(num_suffixes, is);
    suffix_subtries_.resize(num_suffixes);
    for (size_t i = 0; i < num_suffixes; ++i) {
      bool has_trie{};
      utils::read_value(has_trie, is);
      if (has_trie) {
        suffix_subtries_[i] = make_unique<SuffixTrieType>(is);
      }
    }
    utils::read_value(suffix_head_, is);
    utils::read_value(num_keys_, is);
  }